

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_X509.cpp
# Opt level: O3

bool __thiscall axl::cry::X509Store::create(X509Store *this)

{
  bool bVar1;
  X509_STORE *pXVar2;
  
  pXVar2 = (X509_STORE *)
           (this->
           super_Handle<x509_store_st_*,_axl::cry::FreeX509Store,_axl::sl::Zero<x509_store_st_*>_>).
           m_h;
  if (pXVar2 != (X509_STORE *)0x0) {
    X509_STORE_free(pXVar2);
    (this->super_Handle<x509_store_st_*,_axl::cry::FreeX509Store,_axl::sl::Zero<x509_store_st_*>_>).
    m_h = (x509_store_st *)0x0;
  }
  pXVar2 = X509_STORE_new();
  (this->super_Handle<x509_store_st_*,_axl::cry::FreeX509Store,_axl::sl::Zero<x509_store_st_*>_>).
  m_h = (x509_store_st *)pXVar2;
  bVar1 = completeWithLastCryptoError<bool>(pXVar2 != (X509_STORE *)0x0,false);
  return bVar1;
}

Assistant:

bool
X509Store::create() {
	close();
	m_h = X509_STORE_new();
	return completeWithLastCryptoError(m_h != NULL);
}